

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

problem * baryonyx::affect(problem *__return_storage_ptr__,context *ctx,problem *pb,
                          int variable_index,bool variable_value)

{
  bool bVar1;
  problem *ctx_00;
  int iVar2;
  const_reference arg1;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  undefined1 local_148 [8];
  preprocessor<baryonyx::problem> pp;
  baryonyx local_58 [16];
  string local_48;
  bool local_25;
  int local_24;
  bool variable_value_local;
  problem *ppStack_20;
  int variable_index_local;
  problem *pb_local;
  context *ctx_local;
  
  bVar1 = false;
  local_25 = variable_value;
  local_24 = variable_index;
  ppStack_20 = pb;
  pb_local = (problem *)ctx;
  ctx_local = (context *)__return_storage_ptr__;
  if (-1 < variable_index) {
    iVar2 = length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                      (&(pb->vars).values);
    bVar1 = variable_index < iVar2;
  }
  ctx_00 = pb_local;
  if (!bVar1) {
    details::fail_fast("Precondition",
                       "variable_index >= 0 && variable_index < length(pb.vars.values)",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                       ,"889");
  }
  arg1 = std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::operator[](&(ppStack_20->vars).names,(long)local_24);
  size = memory_consumed(ppStack_20);
  memory_consumed_size<unsigned_long>(local_58,size);
  to_string_abi_cxx11_(&local_48,local_58,mem);
  info<std::basic_string_view<char,std::char_traits<char>>,bool,std::__cxx11::string>
            ((context *)ctx_00,
             "  - Preprocessor starts affectation of variable {} to {} (size: {})\n",arg1,&local_25,
             &local_48);
  std::__cxx11::string::~string((string *)&local_48);
  anon_unknown.dwarf_ccf27::preprocessor<baryonyx::problem>::preprocessor
            ((preprocessor<baryonyx::problem> *)local_148,(context *)pb_local,ppStack_20);
  anon_unknown.dwarf_ccf27::preprocessor<baryonyx::problem>::operator()
            (__return_storage_ptr__,(preprocessor<baryonyx::problem> *)local_148,local_24,
             (bool)(local_25 & 1));
  anon_unknown.dwarf_ccf27::preprocessor<baryonyx::problem>::~preprocessor
            ((preprocessor<baryonyx::problem> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

problem
affect(const context& ctx,
       const problem& pb,
       int variable_index,
       bool variable_value)
{
    bx_expects(variable_index >= 0 && variable_index < length(pb.vars.values));

    info(
      ctx,
      "  - Preprocessor starts affectation of variable {} to {} (size: {})\n",
      pb.vars.names[variable_index],
      variable_value,
      to_string(memory_consumed_size(memory_consumed(pb))));

    ::preprocessor<problem> pp(ctx, pb);

    return pp(variable_index, variable_value);
}